

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Printer::Print
          (Printer *this,Message *message,ZeroCopyOutputStream *output,FieldReporterLevel reporter)

{
  byte bVar1;
  TextGenerator generator;
  TextGenerator local_38;
  
  local_38.insert_silent_marker_ = this->insert_silent_marker_;
  local_38.indent_level_ = this->initial_indent_level_;
  local_38.super_BaseTextGenerator._vptr_BaseTextGenerator =
       (_func_int **)&PTR__TextGenerator_01693ec8;
  local_38.buffer_ = (char *)0x0;
  local_38.buffer_size_ = 0;
  local_38.at_start_of_line_ = true;
  local_38.failed_ = false;
  local_38.output_ = output;
  local_38.initial_indent_level_ = local_38.indent_level_;
  internal::PrintTextMarker
            (&local_38.super_BaseTextGenerator,this->redact_debug_string_,
             this->randomize_debug_string_,this->single_line_mode_);
  Print(this,message,&local_38.super_BaseTextGenerator);
  bVar1 = local_38.failed_ ^ 1;
  TextGenerator::~TextGenerator(&local_38);
  return (bool)bVar1;
}

Assistant:

bool TextFormat::Printer::Print(const Message& message,
                                io::ZeroCopyOutputStream* output,
                                internal::FieldReporterLevel reporter) const {
  TextGenerator generator(output, insert_silent_marker_, initial_indent_level_);

  internal::PrintTextMarker(&generator, redact_debug_string_,
                            randomize_debug_string_, single_line_mode_);


  Print(message, &generator);

  // Output false if the generator failed internally.
  return !generator.failed();
}